

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall
ObjectModelBuilder::buildClass(ObjectModelBuilder *this,object *classObject,bool declaration)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  undefined8 this_00;
  bool bVar4;
  bool bVar5;
  Class *clazz;
  mapped_type *ppCVar6;
  ostream *poVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  string *resourceString;
  string *psVar10;
  vector<picojson::value,_std::allocator<picojson::value>_> *this_01;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *this_02;
  object *object;
  long lVar11;
  _Base_ptr p_Var12;
  char *pcVar13;
  _Alloc_hider _Var14;
  undefined1 local_b8 [8];
  string alloc;
  undefined1 local_90 [8];
  string name;
  undefined1 local_50 [8];
  string include;
  
  findStringInObject((string *)local_90,classObject,"name");
  if (name._M_dataplus._M_p == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class ",0xd);
    pcVar13 = "";
    if (declaration) {
      pcVar13 = "declaration";
    }
    lVar11 = 0xb;
    if (!declaration) {
      lVar11 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," missing \'name\'",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    goto LAB_0010c4e9;
  }
  clazz = (Class *)operator_new(0xe8);
  __s = &(clazz->name).field_2;
  memset(__s,0,0xd8);
  (clazz->name)._M_dataplus._M_p = (pointer)__s;
  (clazz->name)._M_string_length = 0;
  (clazz->include)._M_dataplus._M_p = (pointer)&(clazz->include).field_2;
  (clazz->include).field_2._M_local_buf[0] = '\0';
  (clazz->alloc)._M_dataplus._M_p = (pointer)&(clazz->alloc).field_2;
  (clazz->alloc).field_2._M_local_buf[0] = '\0';
  (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->signals).super__Vector_base<Signal,_std::allocator<Signal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->functions).super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)clazz);
  ppCVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::operator[](&this->m_classes,(key_type *)local_90);
  *ppCVar6 = clazz;
  if (declaration) {
    findStringInObject((string *)local_50,classObject,"include");
    if (include._M_dataplus._M_p == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"declaration",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," missing \'include\', name=",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_50 != (undefined1  [8])&include._M_string_length) {
        operator_delete((void *)local_50);
      }
      goto LAB_0010c4e9;
    }
    findStringInObject((string *)local_b8,classObject,"alloc");
    _Var14 = alloc._M_dataplus;
    if (alloc._M_dataplus._M_p == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"declaration",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," missing \'alloc\', name=",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
LAB_0010c6b1:
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::_M_assign((string *)&clazz->include);
      std::__cxx11::string::_M_assign((string *)&clazz->alloc);
      clazz->declarationOnly = true;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_includes,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      if (this->m_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Class (declaration): name=\'",0x1b);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' include=\'",0xb);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_50,(long)include._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' alloc=\'",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_b8,(long)alloc._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        goto LAB_0010c6b1;
      }
    }
    if (local_b8 != (undefined1  [8])&alloc._M_string_length) {
      operator_delete((void *)local_b8);
    }
    if (local_50 != (undefined1  [8])&include._M_string_length) {
      operator_delete((void *)local_50);
    }
    if (_Var14._M_p == (pointer)0x0) goto LAB_0010c4e9;
  }
  else if (this->m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Class: name=\'",0xd);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"properties","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find(&classObject->_M_t,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  name.field_2._8_8_ = &(classObject->_M_t)._M_impl.super__Rb_tree_header;
  alloc.field_2._8_8_ = classObject;
  if (cVar8._M_node != (_Base_ptr)name.field_2._8_8_) {
    if (cVar8._M_node[2]._M_color == 3) {
      bVar4 = buildProperty(this,(string *)cVar8._M_node[2]._M_parent,clazz);
      if (bVar4) goto LAB_0010c896;
    }
    else {
      if (cVar8._M_node[2]._M_color == 4) {
        p_Var2 = (cVar8._M_node[2]._M_parent)->_M_parent;
        for (p_Var12 = *(_Base_ptr *)cVar8._M_node[2]._M_parent; p_Var12 != p_Var2;
            p_Var12 = (_Base_ptr)&p_Var12->_M_left) {
          _Var1 = p_Var12->_M_color;
          local_50._4_4_ = (undefined4)((ulong)local_50 >> 0x20);
          local_50._0_4_ = _Var1;
          if (_Var1 == 5) {
            p_Var9 = (_Base_ptr)operator_new(0x30);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        *)p_Var9,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        *)p_Var12->_M_parent);
          }
          else if (_Var1 == 4) {
            p_Var9 = (_Base_ptr)operator_new(0x18);
            std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9,
                       (vector<picojson::value,_std::allocator<picojson::value>_> *)
                       p_Var12->_M_parent);
          }
          else if (_Var1 == 3) {
            p_Var9 = (_Base_ptr)operator_new(0x20);
            p_Var3 = p_Var12->_M_parent;
            *(_Base_ptr **)p_Var9 = &p_Var9->_M_left;
            lVar11 = *(long *)p_Var3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)p_Var9,lVar11,(long)&p_Var3->_M_parent->_M_color + lVar11);
          }
          else {
            p_Var9 = p_Var12->_M_parent;
          }
          include._M_dataplus._M_p = (pointer)p_Var9;
          bVar4 = buildMaybeProperty(this,(value *)local_50,clazz);
          if (_Var1 == 5) {
            if (p_Var9 == (_Base_ptr)0x0) {
LAB_0010c859:
              p_Var9 = (_Base_ptr)0x0;
            }
            else {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)p_Var9);
            }
LAB_0010c85c:
            operator_delete(p_Var9);
          }
          else {
            if (_Var1 == 4) {
              if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010c859;
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9);
              goto LAB_0010c85c;
            }
            if (_Var1 == 3) {
              if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010c859;
              if ((_Base_ptr *)*(undefined1 **)p_Var9 != &p_Var9->_M_left) {
                operator_delete(*(undefined1 **)p_Var9);
              }
              goto LAB_0010c85c;
            }
          }
          if (!bVar4) goto LAB_0010c4e9;
        }
        goto LAB_0010c896;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: invalid property in class=",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    goto LAB_0010c4e9;
  }
LAB_0010c896:
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"signals","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  *)alloc.field_2._8_8_,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (cVar8._M_node != (_Base_ptr)name.field_2._8_8_) {
    if (cVar8._M_node[2]._M_color == 3) {
      bVar4 = buildSignal(this,(string *)cVar8._M_node[2]._M_parent,clazz);
      if (bVar4) goto LAB_0010ca8b;
    }
    else {
      if (cVar8._M_node[2]._M_color == 4) {
        p_Var2 = (cVar8._M_node[2]._M_parent)->_M_parent;
        for (p_Var12 = *(_Base_ptr *)cVar8._M_node[2]._M_parent; p_Var12 != p_Var2;
            p_Var12 = (_Base_ptr)&p_Var12->_M_left) {
          _Var1 = p_Var12->_M_color;
          local_50._4_4_ = (undefined4)((ulong)local_50 >> 0x20);
          local_50._0_4_ = _Var1;
          if (_Var1 == 5) {
            p_Var9 = (_Base_ptr)operator_new(0x30);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        *)p_Var9,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        *)p_Var12->_M_parent);
          }
          else if (_Var1 == 4) {
            p_Var9 = (_Base_ptr)operator_new(0x18);
            std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9,
                       (vector<picojson::value,_std::allocator<picojson::value>_> *)
                       p_Var12->_M_parent);
          }
          else if (_Var1 == 3) {
            p_Var9 = (_Base_ptr)operator_new(0x20);
            p_Var3 = p_Var12->_M_parent;
            *(_Base_ptr **)p_Var9 = &p_Var9->_M_left;
            lVar11 = *(long *)p_Var3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)p_Var9,lVar11,(long)&p_Var3->_M_parent->_M_color + lVar11);
          }
          else {
            p_Var9 = p_Var12->_M_parent;
          }
          include._M_dataplus._M_p = (pointer)p_Var9;
          bVar4 = buildMaybeSignal(this,(value *)local_50,clazz);
          if (_Var1 == 5) {
            if (p_Var9 == (_Base_ptr)0x0) {
LAB_0010c9f0:
              p_Var9 = (_Base_ptr)0x0;
            }
            else {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)p_Var9);
            }
LAB_0010c9f3:
            operator_delete(p_Var9);
          }
          else {
            if (_Var1 == 4) {
              if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010c9f0;
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9);
              goto LAB_0010c9f3;
            }
            if (_Var1 == 3) {
              if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010c9f0;
              if ((_Base_ptr *)*(undefined1 **)p_Var9 != &p_Var9->_M_left) {
                operator_delete(*(undefined1 **)p_Var9);
              }
              goto LAB_0010c9f3;
            }
          }
          if (!bVar4) goto LAB_0010c4e9;
        }
        goto LAB_0010ca8b;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: invalid signal in class=",0x1f);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    goto LAB_0010c4e9;
  }
LAB_0010ca8b:
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"functions","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  *)alloc.field_2._8_8_,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (cVar8._M_node != (_Base_ptr)name.field_2._8_8_) {
    if (cVar8._M_node[2]._M_color == 3) {
      buildFunction(this,(string *)cVar8._M_node[2]._M_parent,clazz);
    }
    else {
      if (cVar8._M_node[2]._M_color != 4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"error: invalid function in class=",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        goto LAB_0010c4e9;
      }
      p_Var2 = (cVar8._M_node[2]._M_parent)->_M_parent;
      for (p_Var12 = *(_Base_ptr *)cVar8._M_node[2]._M_parent; p_Var12 != p_Var2;
          p_Var12 = (_Base_ptr)&p_Var12->_M_left) {
        _Var1 = p_Var12->_M_color;
        local_50._4_4_ = (undefined4)((ulong)local_50 >> 0x20);
        local_50._0_4_ = _Var1;
        if (_Var1 == 5) {
          p_Var9 = (_Base_ptr)operator_new(0x30);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)p_Var9,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)p_Var12->_M_parent);
        }
        else if (_Var1 == 4) {
          p_Var9 = (_Base_ptr)operator_new(0x18);
          std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9,
                     (vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var12->_M_parent
                    );
        }
        else if (_Var1 == 3) {
          p_Var9 = (_Base_ptr)operator_new(0x20);
          p_Var3 = p_Var12->_M_parent;
          *(_Base_ptr **)p_Var9 = &p_Var9->_M_left;
          lVar11 = *(long *)p_Var3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)p_Var9,lVar11,(long)&p_Var3->_M_parent->_M_color + lVar11);
        }
        else {
          p_Var9 = p_Var12->_M_parent;
        }
        include._M_dataplus._M_p = (pointer)p_Var9;
        bVar4 = buildMaybeFunction(this,(value *)local_50,clazz);
        if (_Var1 == 5) {
          if (p_Var9 == (_Base_ptr)0x0) {
LAB_0010cbe5:
            p_Var9 = (_Base_ptr)0x0;
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)p_Var9);
          }
LAB_0010cbe8:
          operator_delete(p_Var9);
        }
        else {
          if (_Var1 == 4) {
            if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010cbe5;
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9);
            goto LAB_0010cbe8;
          }
          if (_Var1 == 3) {
            if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010cbe5;
            if ((_Base_ptr *)*(undefined1 **)p_Var9 != &p_Var9->_M_left) {
              operator_delete(*(undefined1 **)p_Var9);
            }
            goto LAB_0010cbe8;
          }
        }
        if (!bVar4) goto LAB_0010c4e9;
      }
    }
  }
  local_50 = (undefined1  [8])&include._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"resources","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  *)alloc.field_2._8_8_,(key_type *)local_50);
  if (local_50 != (undefined1  [8])&include._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (cVar8._M_node == (_Base_ptr)name.field_2._8_8_) {
LAB_0010ce7a:
    this_00 = alloc.field_2._8_8_;
    if (!declaration) {
      local_50 = (undefined1  [8])&include._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"root","");
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)this_00,(key_type *)local_50);
      if (local_50 != (undefined1  [8])&include._M_string_length) {
        operator_delete((void *)local_50);
      }
      if ((cVar8._M_node != (_Base_ptr)name.field_2._8_8_) &&
         (bVar4 = buildObject(this,(value *)(cVar8._M_node + 2),(Object *)0x0,clazz), !bVar4))
      goto LAB_0010c4e9;
    }
    local_50 = (undefined1  [8])&include._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"replicators","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                    *)this_00,(key_type *)local_50);
    if (local_50 != (undefined1  [8])&include._M_string_length) {
      operator_delete((void *)local_50);
    }
    bVar4 = true;
    if (cVar8._M_node == (_Base_ptr)name.field_2._8_8_) goto LAB_0010c4ec;
    if (cVar8._M_node[2]._M_color == 5) {
      object = picojson::value::
               get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                         ((value *)(cVar8._M_node + 2));
      bVar5 = buildReplicator(this,object,clazz);
      if (bVar5) goto LAB_0010c4ec;
    }
    else {
      if (cVar8._M_node[2]._M_color == 4) {
        p_Var12 = *(_Base_ptr *)cVar8._M_node[2]._M_parent;
        name.field_2._8_8_ = (cVar8._M_node[2]._M_parent)->_M_parent;
        if (p_Var12 != (_Base_ptr)name.field_2._8_8_) {
          do {
            _Var1 = p_Var12->_M_color;
            local_50._0_4_ = _Var1;
            if (_Var1 == 5) {
              this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)operator_new(0x30);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::_Rb_tree(this_02,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                                  *)p_Var12->_M_parent);
              include._M_dataplus._M_p = (pointer)this_02;
            }
            else if (_Var1 == 4) {
              this_01 = (vector<picojson::value,_std::allocator<picojson::value>_> *)
                        operator_new(0x18);
              std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
                        (this_01,(vector<picojson::value,_std::allocator<picojson::value>_> *)
                                 p_Var12->_M_parent);
              include._M_dataplus._M_p = (pointer)this_01;
            }
            else if (_Var1 == 3) {
              psVar10 = (string *)operator_new(0x20);
              p_Var2 = p_Var12->_M_parent;
              *(string **)psVar10 = psVar10 + 0x10;
              lVar11 = *(long *)p_Var2;
              std::__cxx11::string::_M_construct<char*>
                        (psVar10,lVar11,(long)&p_Var2->_M_parent->_M_color + lVar11);
              include._M_dataplus._M_p = (pointer)psVar10;
            }
            else {
              include._M_dataplus._M_p = (pointer)p_Var12->_M_parent;
            }
            _Var14._M_p = include._M_dataplus._M_p;
            bVar5 = buildMaybeReplicator(this,(value *)local_50,clazz);
            if (_Var1 == 5) {
              if (_Var14._M_p == (pointer)0x0) {
LAB_0010d060:
                _Var14._M_p = (pointer)0x0;
              }
              else {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)_Var14._M_p);
              }
LAB_0010d063:
              operator_delete(_Var14._M_p);
            }
            else {
              if (_Var1 == 4) {
                if (_Var14._M_p == (pointer)0x0) goto LAB_0010d060;
                std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                          ((vector<picojson::value,_std::allocator<picojson::value>_> *)_Var14._M_p)
                ;
                goto LAB_0010d063;
              }
              if (_Var1 == 3) {
                if (_Var14._M_p == (pointer)0x0) goto LAB_0010d060;
                if (*_Var14._M_p != _Var14._M_p + 0x10) {
                  operator_delete(*_Var14._M_p);
                }
                goto LAB_0010d063;
              }
            }
            if (!bVar5) goto LAB_0010c4e9;
            p_Var12 = (_Base_ptr)&p_Var12->_M_left;
          } while (p_Var12 != (_Base_ptr)name.field_2._8_8_);
        }
        goto LAB_0010c4ec;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: invalid \'replicators\' in class=",0x26);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  else if (cVar8._M_node[2]._M_color == 3) {
    resourceString = picojson::value::get<std::__cxx11::string>((value *)(cVar8._M_node + 2));
    bVar4 = buildResource(this,resourceString,clazz);
    if (bVar4) goto LAB_0010ce7a;
  }
  else {
    if (cVar8._M_node[2]._M_color == 4) {
      p_Var2 = (cVar8._M_node[2]._M_parent)->_M_parent;
      for (p_Var12 = *(_Base_ptr *)cVar8._M_node[2]._M_parent; p_Var12 != p_Var2;
          p_Var12 = (_Base_ptr)&p_Var12->_M_left) {
        _Var1 = p_Var12->_M_color;
        local_50._4_4_ = (undefined4)((ulong)local_50 >> 0x20);
        local_50._0_4_ = _Var1;
        if (_Var1 == 5) {
          p_Var9 = (_Base_ptr)operator_new(0x30);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)p_Var9,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)p_Var12->_M_parent);
        }
        else if (_Var1 == 4) {
          p_Var9 = (_Base_ptr)operator_new(0x18);
          std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9,
                     (vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var12->_M_parent
                    );
        }
        else if (_Var1 == 3) {
          p_Var9 = (_Base_ptr)operator_new(0x20);
          p_Var3 = p_Var12->_M_parent;
          *(_Base_ptr **)p_Var9 = &p_Var9->_M_left;
          lVar11 = *(long *)p_Var3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)p_Var9,lVar11,(long)&p_Var3->_M_parent->_M_color + lVar11);
        }
        else {
          p_Var9 = p_Var12->_M_parent;
        }
        include._M_dataplus._M_p = (pointer)p_Var9;
        bVar4 = buildMaybeResource(this,(value *)local_50,clazz);
        if (_Var1 == 5) {
          if (p_Var9 == (_Base_ptr)0x0) {
LAB_0010cdd2:
            p_Var9 = (_Base_ptr)0x0;
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)p_Var9);
          }
LAB_0010cdd5:
          operator_delete(p_Var9);
        }
        else {
          if (_Var1 == 4) {
            if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010cdd2;
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)p_Var9);
            goto LAB_0010cdd5;
          }
          if (_Var1 == 3) {
            if (p_Var9 == (_Base_ptr)0x0) goto LAB_0010cdd2;
            if ((_Base_ptr *)*(undefined1 **)p_Var9 != &p_Var9->_M_left) {
              operator_delete(*(undefined1 **)p_Var9);
            }
            goto LAB_0010cdd5;
          }
        }
        if (!bVar4) goto LAB_0010c4e9;
      }
      goto LAB_0010ce7a;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: invalid resource in class=",0x21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_90,(long)name._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
LAB_0010c4e9:
  bVar4 = false;
LAB_0010c4ec:
  if (local_90 != (undefined1  [8])&name._M_string_length) {
    operator_delete((void *)local_90);
  }
  return bVar4;
}

Assistant:

bool ObjectModelBuilder::buildClass(const picojson::object &classObject, bool declaration)
{
    // Class *clazz = new Class();
    std::string name = findStringInObject(classObject, "name");
    if (name.empty()) {
        std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'name'" << std::endl;
        return false;
    }

    Class *clazz = new Class();
    clazz->name = name;
    m_classes[name] = clazz;

    if (declaration) {
        std::string include = findStringInObject(classObject, "include");
        if (include.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'include', name=" << name << std::endl;
            return false;
        }
        std::string alloc = findStringInObject(classObject, "alloc");
        if (alloc.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'alloc', name=" << name << std::endl;
            return false;
        }
        clazz->include = include;
        clazz->alloc = alloc;
        clazz->declarationOnly = true;

        m_includes.insert(include);
        if (m_verbose)
            std::cerr << "Class (declaration): name='" << name << "' include='" << include << "' alloc='" << alloc << "'" << std::endl;
    } else {
        if (m_verbose)
            std::cerr << "Class: name='" << name << "'" << std::endl;
    }


    auto propertyIt = classObject.find("properties");
    if (propertyIt != classObject.end()) {
        const picojson::value &props = propertyIt->second;
        if (props.is<picojson::array>()) {
            for (auto prop : props.get<picojson::array>()) {
                if (!buildMaybeProperty(prop, clazz))
                    return false;
            }
        } else if (props.is<std::string>()) {
            if (!buildProperty(props.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid property in class=" << name << std::endl;
            return false;
        }
    }

    auto signalIt = classObject.find("signals");
    if (signalIt != classObject.end()) {
        const picojson::value &signals = signalIt->second;
        if (signals.is<picojson::array>()) {
            for (auto signal : signals.get<picojson::array>())
                if (!buildMaybeSignal(signal, clazz))
                    return false;
        } else if (signals.is<std::string>()) {
            if (!buildSignal(signals.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid signal in class=" << name << std::endl;
            return false;
        }
    }

    auto functionsIt = classObject.find("functions");
    if (functionsIt != classObject.end()) {
        const picojson::value &functions = functionsIt->second;
        if (functions.is<picojson::array>()) {
            for (auto function : functions.get<picojson::array>())
                if (!buildMaybeFunction(function, clazz))
                    return false;
        } else if (functions.is<std::string>()) {
            if (!buildFunction(functions.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid function in class=" << name << std::endl;
            return false;
        }
    }

    auto resourcesIt = classObject.find("resources");
    if (resourcesIt != classObject.end()) {
        const picojson::value &resources = resourcesIt->second;
        if (resources.is<picojson::array>()) {
            for (auto resource : resources.get<picojson::array>())
                if (!buildMaybeResource(resource, clazz))
                    return false;
        } else if (resources.is<std::string>()) {
            if (!buildResource(resources.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid resource in class=" << name << std::endl;
            return false;
        }
    }

    if (!declaration) {
        auto rootIt = classObject.find("root");
        if (rootIt != classObject.end()) {
            const picojson::value &root = rootIt->second;
            if (!buildObject(root, 0, clazz))
                return false;
        }

    }

    auto replicatorsIt = classObject.find("replicators");
    if (replicatorsIt != classObject.end()) {
        const picojson::value &replicators = replicatorsIt->second;
        if (replicators.is<picojson::array>()) {
            for (auto replicator : replicators.get<picojson::array>())
                if (!buildMaybeReplicator(replicator, clazz))
                    return false;
        } else if (replicators.is<picojson::object>()) {
            if (!buildReplicator(replicators.get<picojson::object>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid 'replicators' in class=" << name << std::endl;
            return false;
        }
    }

    return true;
}